

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FileDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this)

{
  _Rb_tree_header *__position;
  undefined8 *puVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  long lVar13;
  int *piVar14;
  long lVar15;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  SubstituteArg local_90;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"syntax = \"proto2\";\n\n","");
  __position = &public_dependencies._M_t._M_impl.super__Rb_tree_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header
  ;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar14 = *(int **)(this + 0x30);
  groups._M_t._M_impl._0_8_ = &public_dependencies;
  if ((long)*(int *)(this + 0x28) != 0) {
    lVar9 = (long)*(int *)(this + 0x28) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &public_dependencies,(const_iterator)__position,piVar14,(_Alloc_node *)&groups);
      piVar14 = piVar14 + 1;
      lVar9 = lVar9 + -4;
    } while (lVar9 != 0);
  }
  piVar14 = *(int **)(this + 0x40);
  groups._M_t._M_impl._0_8_ = &weak_dependencies;
  if ((long)*(int *)(this + 0x38) != 0) {
    lVar9 = (long)*(int *)(this + 0x38) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &weak_dependencies,
                 (const_iterator)&weak_dependencies._M_t._M_impl.super__Rb_tree_header,piVar14,
                 (_Alloc_node *)&groups);
      piVar14 = piVar14 + 1;
      lVar9 = lVar9 + -4;
    } while (lVar9 != 0);
  }
  if (0 < *(int *)(this + 0x18)) {
    lVar9 = 0;
    do {
      p_Var3 = public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &__position->_M_header;
      if (public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
          (_Base_ptr)0x0) {
LAB_001cd928:
        if (weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Base_ptr)0x0) {
          p_Var3 = weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var12 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var11 = p_Var12;
            p_Var6 = p_Var3;
            lVar8 = (long)(int)p_Var6[1]._M_color;
            p_Var12 = p_Var6;
            if (lVar8 < lVar9) {
              p_Var12 = p_Var11;
            }
            p_Var3 = (&p_Var6->_M_left)[lVar8 < lVar9];
          } while ((&p_Var6->_M_left)[lVar8 < lVar9] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var12 != &weak_dependencies._M_t._M_impl.super__Rb_tree_header) {
            if (lVar8 < lVar9) {
              p_Var6 = p_Var11;
            }
            if ((int)p_Var6[1]._M_color <= lVar9) {
              puVar1 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar9 * 8);
              groups._M_t._M_impl._0_8_ = *puVar1;
              groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   *(_Rb_tree_color *)(puVar1 + 1);
              local_240.text_ = (char *)0x0;
              local_240.size_ = -1;
              local_120.text_ = (char *)0x0;
              local_120.size_ = -1;
              local_150.text_ = (char *)0x0;
              local_150.size_ = -1;
              local_180.text_ = (char *)0x0;
              local_180.size_ = -1;
              local_1b0.text_ = (char *)0x0;
              local_1b0.size_ = -1;
              local_1e0.text_ = (char *)0x0;
              local_1e0.size_ = -1;
              local_210.text_ = (char *)0x0;
              local_210.size_ = -1;
              local_f0.text_ = (char *)0x0;
              local_f0.size_ = -1;
              local_270.text_ = (char *)0x0;
              local_270.size_ = -1;
              strings::SubstituteAndAppend
                        (__return_storage_ptr__,"import weak \"$0\";\n",(SubstituteArg *)&groups,
                         &local_240,&local_120,&local_150,&local_180,&local_1b0,&local_1e0,
                         &local_210,&local_f0,&local_270);
              goto LAB_001cdc5f;
            }
          }
        }
        puVar1 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar9 * 8);
        groups._M_t._M_impl._0_8_ = *puVar1;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar1 + 1);
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import \"$0\";\n",(SubstituteArg *)&groups,&local_240,
                   &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210,&local_f0,
                   &local_270);
      }
      else {
        do {
          p_Var11 = p_Var12;
          p_Var6 = p_Var3;
          lVar8 = (long)(int)p_Var6[1]._M_color;
          p_Var12 = p_Var6;
          if (lVar8 < lVar9) {
            p_Var12 = p_Var11;
          }
          p_Var3 = (&p_Var6->_M_left)[lVar8 < lVar9];
        } while ((&p_Var6->_M_left)[lVar8 < lVar9] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var12 == __position) goto LAB_001cd928;
        if (lVar8 < lVar9) {
          p_Var6 = p_Var11;
        }
        if (lVar9 < (int)p_Var6[1]._M_color) goto LAB_001cd928;
        puVar1 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar9 * 8);
        groups._M_t._M_impl._0_8_ = *puVar1;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar1 + 1);
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import public \"$0\";\n",(SubstituteArg *)&groups,
                   &local_240,&local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210,
                   &local_f0,&local_270);
      }
LAB_001cdc5f:
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(this + 0x18));
  }
  lVar9 = (*(undefined8 **)(this + 8))[1];
  if (lVar9 != 0) {
    groups._M_t._M_impl._0_8_ = **(undefined8 **)(this + 8);
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)lVar9;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_270.text_ = (char *)0x0;
    local_270.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",(SubstituteArg *)&groups,&local_240,
               &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210,&local_f0,
               &local_270);
  }
  bVar4 = anon_unknown_1::FormatLineOptions(0,*(Message **)(this + 0x88),__return_storage_ptr__);
  if (bVar4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (0 < *(int *)(this + 0x58)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(*(long *)(this + 0x60) + lVar9),0,__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x38;
    } while (lVar8 < *(int *)(this + 0x58));
  }
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groups._M_t._M_impl.super__Rb_tree_header._M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar5 = *(int *)(this + 0x78);
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < iVar5) {
    lVar9 = 0x48;
    lVar8 = 0;
    do {
      if (*(int *)(*(long *)(this + 0x80) + -0x1c + lVar9) == 10) {
        local_240.text_ = *(char **)(*(long *)(this + 0x80) + lVar9);
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_240);
        iVar5 = *(int *)(this + 0x78);
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x78;
    } while (lVar8 < iVar5);
  }
  iVar5 = *(int *)(this + 0x48);
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      plVar7 = (long *)(*(long *)(this + 0x50) + lVar9 * 0x78);
      if (groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001cde8e:
        local_240.text_ = *(char **)*plVar7;
        local_240.size_ = *(int *)((undefined8 *)*plVar7 + 1);
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"message $0",&local_240,&local_120,&local_150,&local_180,
                   &local_1b0,&local_1e0,&local_210,&local_f0,&local_270,&local_90);
        Descriptor::DebugString
                  ((Descriptor *)(lVar9 * 0x78 + *(long *)(this + 0x50)),0,__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        iVar5 = *(int *)(this + 0x48);
      }
      else {
        p_Var3 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var12 = &groups._M_t._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var11 = p_Var12;
          p_Var6 = p_Var3;
          plVar2 = *(long **)(p_Var6 + 1);
          p_Var12 = p_Var6;
          if (plVar2 < plVar7) {
            p_Var12 = p_Var11;
          }
          p_Var3 = (&p_Var6->_M_left)[plVar2 < plVar7];
        } while ((&p_Var6->_M_left)[plVar2 < plVar7] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var12 == &groups._M_t._M_impl.super__Rb_tree_header)
        goto LAB_001cde8e;
        if (plVar2 < plVar7) {
          p_Var6 = p_Var11;
        }
        if (plVar7 < *(long **)(p_Var6 + 1)) goto LAB_001cde8e;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      ServiceDescriptor::DebugString
                ((ServiceDescriptor *)(*(long *)(this + 0x70) + lVar9),__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x30;
    } while (lVar8 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar8 = 0;
    lVar15 = 0;
    lVar9 = 0;
    do {
      lVar13 = *(long *)(this + 0x80);
      lVar10 = *(long *)(lVar13 + 0x38 + lVar8);
      if (lVar10 != lVar9) {
        if (lVar8 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          lVar10 = *(long *)(*(long *)(this + 0x80) + 0x38 + lVar8);
        }
        local_240.text_ = (char *)**(undefined8 **)(lVar10 + 8);
        local_240.size_ = *(int *)(*(undefined8 **)(lVar10 + 8) + 1);
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"extend .$0 {\n",&local_240,&local_120,&local_150,
                   &local_180,&local_1b0,&local_1e0,&local_210,&local_f0,&local_270,&local_90);
        lVar13 = *(long *)(this + 0x80);
        lVar9 = lVar10;
      }
      FieldDescriptor::DebugString((FieldDescriptor *)(lVar13 + lVar8),1,__return_storage_ptr__);
      lVar15 = lVar15 + 1;
      lVar8 = lVar8 + 0x78;
    } while (lVar15 < *(int *)(this + 0x78));
    if (0 < *(int *)(this + 0x78)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&weak_dependencies._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&public_dependencies._M_t);
  return __return_storage_ptr__;
}

Assistant:

string FileDescriptor::DebugString() const {
  string contents = "syntax = \"proto2\";\n\n";

  set<int> public_dependencies;
  set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
  }

  if (FormatLineOptions(0, options(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      strings::SubstituteAndAppend(&contents, "message $0",
                                   message_type(i)->name());
      message_type(i)->DebugString(0, &contents);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents);
    contents.append("\n");
  }

  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  return contents;
}